

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O2

int IDASetNonlinConvCoef(void *ida_mem,sunrealtype epcon)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x1a1;
  }
  else {
    if (0.0 < epcon) {
      *(sunrealtype *)((long)ida_mem + 0x2f0) = epcon;
      return 0;
    }
    msgfmt = "epcon <= 0.0 illegal.";
    error_code = -0x16;
    line = 0x1a9;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASetNonlinConvCoef",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetNonlinConvCoef(void* ida_mem, sunrealtype epcon)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (epcon <= ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NEG_EPCON);
    return (IDA_ILL_INPUT);
  }

  IDA_mem->ida_epcon = epcon;

  return (IDA_SUCCESS);
}